

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks_tests.c
# Opt level: O3

TestSuite * mock_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("mock_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/mocks_tests.c"
                      ,0x204);
  add_test_(pTVar1,"default_return_value_when_no_presets_for_loose_mock",
            &CgreenSpec__Mocks__default_return_value_when_no_presets_for_loose_mock__);
  add_test_(pTVar1,"can_stub_an_integer_return",&CgreenSpec__Mocks__can_stub_an_integer_return__);
  add_test_(pTVar1,"repeats_return_value_when_set_to_always",
            &CgreenSpec__Mocks__repeats_return_value_when_set_to_always__);
  add_test_(pTVar1,"can_stub_an_integer_return_sequence",
            &CgreenSpec__Mocks__can_stub_an_integer_return_sequence__);
  add_test_(pTVar1,"expectations_are_reset_between_tests_with_loose_mocks",
            &CgreenSpec__Mocks__expectations_are_reset_between_tests_with_loose_mocks__);
  add_test_(pTVar1,"can_stub_a_string_return",&CgreenSpec__Mocks__can_stub_a_string_return__);
  add_test_(pTVar1,"can_stub_a_string_sequence",&CgreenSpec__Mocks__can_stub_a_string_sequence__);
  add_test_(pTVar1,"expecting_once_with_any_parameters",
            &CgreenSpec__Mocks__expecting_once_with_any_parameters__);
  add_test_(pTVar1,"expecting_once_with_parameter_checks_that_parameter",
            &CgreenSpec__Mocks__expecting_once_with_parameter_checks_that_parameter__);
  add_test_(pTVar1,"always_expect_keeps_affirming_parameter",
            &CgreenSpec__Mocks__always_expect_keeps_affirming_parameter__);
  add_test_(pTVar1,"expect_a_sequence",&CgreenSpec__Mocks__expect_a_sequence__);
  add_test_(pTVar1,"string_expect_is_confirmed",&CgreenSpec__Mocks__string_expect_is_confirmed__);
  add_test_(pTVar1,"string_expect_is_confirmed_even_when_null",
            &CgreenSpec__Mocks__string_expect_is_confirmed_even_when_null__);
  add_test_(pTVar1,"string_expect_sequence",&CgreenSpec__Mocks__string_expect_sequence__);
  add_test_(pTVar1,"expecting_once_with_non_null_parameter_checks_that_parameter",
            &CgreenSpec__Mocks__expecting_once_with_non_null_parameter_checks_that_parameter__);
  add_test_(pTVar1,"double_expect_is_confirmed",&CgreenSpec__Mocks__double_expect_is_confirmed__);
  add_test_(pTVar1,"double_expect_sequence",&CgreenSpec__Mocks__double_expect_sequence__);
  add_test_(pTVar1,"confirming_multiple_parameters_multiple_times",
            &CgreenSpec__Mocks__confirming_multiple_parameters_multiple_times__);
  add_test_(pTVar1,"can_mock_full_function_call",&CgreenSpec__Mocks__can_mock_full_function_call__);
  add_test_(pTVar1,"when_called_with_always_should_not_tally_counts",
            &CgreenSpec__Mocks__when_called_with_always_should_not_tally_counts__);
  add_test_(pTVar1,"can_mock_full_sequence",&CgreenSpec__Mocks__can_mock_full_sequence__);
  add_test_(pTVar1,"can_always_mock_full_function_call",
            &CgreenSpec__Mocks__can_always_mock_full_function_call__);
  add_test_(pTVar1,"can_mock_full_function_call_when_there_is_no_space_between_parameters",
            &
            CgreenSpec__Mocks__can_mock_full_function_call_when_there_is_no_space_between_parameters__
           );
  add_test_(pTVar1,"can_stub_an_out_parameter",&CgreenSpec__Mocks__can_stub_an_out_parameter__);
  add_test_(pTVar1,"string_contains_expectation_is_confirmed",
            &CgreenSpec__Mocks__string_contains_expectation_is_confirmed__);
  add_test_(pTVar1,"can_mock_a_function_macro",&CgreenSpec__Mocks__can_mock_a_function_macro__);
  add_test_(pTVar1,"constraint_number_of_calls_when_no_when_is_present",
            &CgreenSpec__Mocks__constraint_number_of_calls_when_no_when_is_present__);
  add_test_(pTVar1,"constraint_number_of_calls_when_is_present",
            &CgreenSpec__Mocks__constraint_number_of_calls_when_is_present__);
  add_test_(pTVar1,"constraint_number_of_calls_when_multiple_expectations_are_present",
            &CgreenSpec__Mocks__constraint_number_of_calls_when_multiple_expectations_are_present__)
  ;
  add_test_(pTVar1,"constraint_number_of_calls_order_of_expectations_matter",
            &CgreenSpec__Mocks__constraint_number_of_calls_order_of_expectations_matter__);
  add_test_(pTVar1,"mock_expect_with_side_effect",&CgreenSpec__Mocks__mock_expect_with_side_effect__
           );
  add_test_(pTVar1,"can_return_by_value",&CgreenSpec__Mocks__can_return_by_value__);
  add_test_(pTVar1,"can_return_by_value_depending_on_input_parameter",
            &CgreenSpec__Mocks__can_return_by_value_depending_on_input_parameter__);
  return pTVar1;
}

Assistant:

TestSuite *mock_tests(void) {
    TestSuite *suite = create_test_suite();
    add_test_with_context(suite, Mocks, default_return_value_when_no_presets_for_loose_mock);
    add_test_with_context(suite, Mocks, can_stub_an_integer_return);
    add_test_with_context(suite, Mocks, repeats_return_value_when_set_to_always);
    add_test_with_context(suite, Mocks, can_stub_an_integer_return_sequence);
    add_test_with_context(suite, Mocks, expectations_are_reset_between_tests_with_loose_mocks);
    add_test_with_context(suite, Mocks, can_stub_a_string_return);
    add_test_with_context(suite, Mocks, can_stub_a_string_sequence);
    add_test_with_context(suite, Mocks, expecting_once_with_any_parameters);
    add_test_with_context(suite, Mocks, expecting_once_with_parameter_checks_that_parameter);
    add_test_with_context(suite, Mocks, always_expect_keeps_affirming_parameter);
    add_test_with_context(suite, Mocks, expect_a_sequence);
    add_test_with_context(suite, Mocks, string_expect_is_confirmed);
    add_test_with_context(suite, Mocks, string_expect_is_confirmed_even_when_null);
    add_test_with_context(suite, Mocks, string_expect_sequence);
    add_test_with_context(suite, Mocks, expecting_once_with_non_null_parameter_checks_that_parameter);
    add_test_with_context(suite, Mocks, double_expect_is_confirmed);
    add_test_with_context(suite, Mocks, double_expect_sequence);
    add_test_with_context(suite, Mocks, confirming_multiple_parameters_multiple_times);
    add_test_with_context(suite, Mocks, can_mock_full_function_call);
    add_test_with_context(suite, Mocks, when_called_with_always_should_not_tally_counts);
    add_test_with_context(suite, Mocks, can_mock_full_sequence);
    add_test_with_context(suite, Mocks, can_always_mock_full_function_call);
    add_test_with_context(suite, Mocks, can_mock_full_function_call_when_there_is_no_space_between_parameters);
    add_test_with_context(suite, Mocks, can_stub_an_out_parameter);
    add_test_with_context(suite, Mocks, string_contains_expectation_is_confirmed);
    add_test_with_context(suite, Mocks, can_mock_a_function_macro);
    add_test_with_context(suite, Mocks, constraint_number_of_calls_when_no_when_is_present);
    add_test_with_context(suite, Mocks, constraint_number_of_calls_when_is_present);
    add_test_with_context(suite, Mocks, constraint_number_of_calls_when_multiple_expectations_are_present);
    add_test_with_context(suite, Mocks, constraint_number_of_calls_order_of_expectations_matter);
    add_test_with_context(suite, Mocks, mock_expect_with_side_effect);
    add_test_with_context(suite, Mocks, can_return_by_value);
    add_test_with_context(suite, Mocks, can_return_by_value_depending_on_input_parameter);

    return suite;
}